

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExportDesc(WastParser *this,Export *export_)

{
  Result RVar1;
  TokenType TVar2;
  Enum EVar3;
  ExternalKind EVar4;
  allocator local_79;
  Token local_78;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  RVar1 = Expect(this,Lpar);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    EVar4 = First;
    TVar2 = Peek(this,0);
    if (TVar2 == Event) {
      EVar4 = Event;
    }
    else if (TVar2 != Func) {
      if (TVar2 == Global) {
        EVar4 = Global;
      }
      else if (TVar2 == Memory) {
        EVar4 = Memory;
      }
      else {
        if (TVar2 != Table) {
          std::__cxx11::string::string((string *)&local_78,"an external kind",&local_79);
          local_38 = 0;
          uStack_30 = 0;
          local_28 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
                     &local_78,&local_78.token_type_);
          RVar1 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_38,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_38);
          std::__cxx11::string::_M_dispose();
          return (Result)RVar1.enum_;
        }
        EVar4 = Table;
      }
    }
    export_->kind = EVar4;
    Consume(&local_78,this);
    RVar1 = ParseVar(this,&export_->var);
    if (RVar1.enum_ != Error) {
      RVar1 = Expect(this,Rpar);
      EVar3 = (Enum)(RVar1.enum_ == Error);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseExportDesc(Export* export_) {
  WABT_TRACE(ParseExportDesc);
  EXPECT(Lpar);
  switch (Peek()) {
    case TokenType::Func:   export_->kind = ExternalKind::Func; break;
    case TokenType::Table:  export_->kind = ExternalKind::Table; break;
    case TokenType::Memory: export_->kind = ExternalKind::Memory; break;
    case TokenType::Global: export_->kind = ExternalKind::Global; break;
    case TokenType::Event:  export_->kind = ExternalKind::Event; break;
    default:
      return ErrorExpected({"an external kind"});
  }
  Consume();
  CHECK_RESULT(ParseVar(&export_->var));
  EXPECT(Rpar);
  return Result::Ok;
}